

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::AreaLightSource
          (BasicSceneBuilder *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  ParameterDictionary *in_RDX;
  string *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParameterDictionary *pPVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *other;
  char (*in_stack_ffffffffffffff20) [16];
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  
  other = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
           *)&stack0x00000008;
  if (*(int *)((long)&in_RDI->field_2 + 8) == 0) {
    ErrorExit<char_const(&)[16]>
              ((FileLoc *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
  }
  std::__cxx11::string::operator=((string *)((long)&in_RDI[1].field_2 + 0x18),in_RSI);
  pPVar1 = (ParameterDictionary *)&stack0xffffffffffffff18;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_RDI,other);
  ParameterDictionary::ParameterDictionary
            ((ParameterDictionary *)in_stack_ffffffffffffff50,
             (ParsedParameterVector *)in_stack_ffffffffffffff48,
             (ParsedParameterVector *)in_stack_ffffffffffffff40,
             (RGBColorSpace *)in_stack_ffffffffffffff38);
  ParameterDictionary::operator=(in_RDX,pPVar1);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x5207bb);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_RDX->params);
  in_RDI[2].nStored = (size_t)(other->alloc).memoryResource;
  in_RDI[3].alloc.memoryResource = (memory_resource *)other->ptr;
  in_RDI[3].ptr = (ParsedParameter **)(other->field_2).fixed[0];
  return;
}

Assistant:

void BasicSceneBuilder::AreaLightSource(const std::string &name,
                                        ParsedParameterVector params, FileLoc loc) {
    VERIFY_WORLD("AreaLightSource");
    graphicsState.areaLightName = name;
    graphicsState.areaLightParams = ParameterDictionary(
        std::move(params), graphicsState.lightAttributes, graphicsState.colorSpace);
    graphicsState.areaLightLoc = loc;
}